

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O0

bool comparesEqual(QByteArray *lhs,QByteArrayView *rhs)

{
  bool bVar1;
  QByteArray *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView *rhs_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rhs_00 = &local_18;
  QByteArrayView::QByteArrayView<QByteArray,_true>(in_RDI,in_RSI);
  bVar1 = operator==((QByteArrayView *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0)
                     ,rhs_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

friend Qt::strong_ordering
    compareThreeWay(const QByteArray &lhs, const QByteArrayView &rhs) noexcept
    {
        const int res = QtPrivate::compareMemory(QByteArrayView(lhs), rhs);
        return Qt::compareThreeWay(res, 0);
    }